

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QItemSelectionRange>>
          (QtPrivate *this,QDebug debug,char *which,QList<QItemSelectionRange> *c)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  QItemSelectionRange *pQVar4;
  QDebug *pQVar5;
  QItemSelectionRange *pQVar6;
  QItemSelectionRange *this_00;
  QItemSelectionRange *pQVar7;
  long in_FS_OFFSET;
  QItemSelectionRange local_60;
  QItemSelectionRange local_50;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar5 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar5,'(');
  pQVar7 = (c->d).ptr;
  lVar2 = (c->d).size;
  pQVar6 = pQVar7 + lVar2;
  if (lVar2 == 0) goto LAB_004eeb25;
  local_50.tl.d = *(QPersistentModelIndexData **)debug.stream;
  this_00 = &local_50;
  *(int *)(local_50.tl.d + 0x28) = *(int *)(local_50.tl.d + 0x28) + 1;
  pQVar4 = &local_50;
  while( true ) {
    ::operator<<((QDebug)&pQVar4->br,this_00);
    QDebug::~QDebug((QDebug *)&pQVar4->br);
    QDebug::~QDebug((QDebug *)this_00);
    pQVar7 = pQVar7 + 1;
LAB_004eeb25:
    if (pQVar7 == pQVar6) break;
    pQVar5 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60.tl.d = (QPersistentModelIndexData *)pQVar5->stream;
    this_00 = &local_60;
    *(int *)((Stream *)local_60.tl.d + 0x28) = *(int *)((Stream *)local_60.tl.d + 0x28) + 1;
    pQVar4 = &local_60;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}